

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

string * __thiscall
google::protobuf::FieldDescriptor::DebugStringWithOptions_abi_cxx11_
          (string *__return_storage_ptr__,FieldDescriptor *this,
          DebugStringOptions *debug_string_options)

{
  bool bVar1;
  Descriptor *this_00;
  string *value;
  SubstituteArg local_218;
  SubstituteArg local_1e8;
  SubstituteArg local_1b8;
  SubstituteArg local_188;
  SubstituteArg local_158;
  SubstituteArg local_128;
  SubstituteArg local_f8;
  SubstituteArg local_c8;
  SubstituteArg local_98;
  SubstituteArg local_68;
  int local_28;
  undefined1 local_21;
  int depth;
  DebugStringOptions *debug_string_options_local;
  FieldDescriptor *this_local;
  string *contents;
  
  local_21 = 0;
  _depth = debug_string_options;
  debug_string_options_local = (DebugStringOptions *)this;
  this_local = (FieldDescriptor *)__return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  local_28 = 0;
  bVar1 = is_extension(this);
  if (bVar1) {
    this_00 = containing_type(this);
    value = Descriptor::full_name_abi_cxx11_(this_00);
    strings::internal::SubstituteArg::SubstituteArg(&local_68,value);
    strings::internal::SubstituteArg::SubstituteArg(&local_98);
    strings::internal::SubstituteArg::SubstituteArg(&local_c8);
    strings::internal::SubstituteArg::SubstituteArg(&local_f8);
    strings::internal::SubstituteArg::SubstituteArg(&local_128);
    strings::internal::SubstituteArg::SubstituteArg(&local_158);
    strings::internal::SubstituteArg::SubstituteArg(&local_188);
    strings::internal::SubstituteArg::SubstituteArg(&local_1b8);
    strings::internal::SubstituteArg::SubstituteArg(&local_1e8);
    strings::internal::SubstituteArg::SubstituteArg(&local_218);
    strings::SubstituteAndAppend
              (__return_storage_ptr__,"extend .$0 {\n",&local_68,&local_98,&local_c8,&local_f8,
               &local_128,&local_158,&local_188,&local_1b8,&local_1e8,&local_218);
    local_28 = 1;
  }
  DebugString(this,local_28,__return_storage_ptr__,_depth);
  bVar1 = is_extension(this);
  if (bVar1) {
    std::__cxx11::string::append((char *)__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FieldDescriptor::DebugStringWithOptions(
    const DebugStringOptions& debug_string_options) const {
  std::string contents;
  int depth = 0;
  if (is_extension()) {
    strings::SubstituteAndAppend(&contents, "extend .$0 {\n",
                              containing_type()->full_name());
    depth = 1;
  }
  DebugString(depth, &contents, debug_string_options);
  if (is_extension()) {
    contents.append("}\n");
  }
  return contents;
}